

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_literals.c
# Opt level: O0

size_t ZSTD_noCompressLiterals(void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  uint uVar1;
  U32 flSize;
  BYTE *ostart;
  size_t srcSize_local;
  void *src_local;
  size_t dstCapacity_local;
  void *dst_local;
  
  uVar1 = (0x1f < srcSize) + 1 + (uint)(0xfff < srcSize);
  if (dstCapacity < srcSize + uVar1) {
    dst_local = (void *)0xffffffffffffffba;
  }
  else {
    if (uVar1 == 1) {
      *(char *)dst = (char)(srcSize << 3);
    }
    else if (uVar1 == 2) {
      MEM_writeLE16(dst,(short)(srcSize << 4) + 4);
    }
    else {
      if (uVar1 != 3) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_literals.c"
                      ,0x3c,"size_t ZSTD_noCompressLiterals(void *, size_t, const void *, size_t)");
      }
      MEM_writeLE32(dst,(int)(srcSize << 4) + 0xc);
    }
    memcpy((void *)((long)dst + (ulong)uVar1),src,srcSize);
    dst_local = (void *)(srcSize + uVar1);
  }
  return (size_t)dst_local;
}

Assistant:

size_t ZSTD_noCompressLiterals (void* dst, size_t dstCapacity, const void* src, size_t srcSize)
{
    BYTE* const ostart = (BYTE*)dst;
    U32   const flSize = 1 + (srcSize>31) + (srcSize>4095);

    DEBUGLOG(5, "ZSTD_noCompressLiterals: srcSize=%zu, dstCapacity=%zu", srcSize, dstCapacity);

    RETURN_ERROR_IF(srcSize + flSize > dstCapacity, dstSize_tooSmall, "");

    switch(flSize)
    {
        case 1: /* 2 - 1 - 5 */
            ostart[0] = (BYTE)((U32)set_basic + (srcSize<<3));
            break;
        case 2: /* 2 - 2 - 12 */
            MEM_writeLE16(ostart, (U16)((U32)set_basic + (1<<2) + (srcSize<<4)));
            break;
        case 3: /* 2 - 2 - 20 */
            MEM_writeLE32(ostart, (U32)((U32)set_basic + (3<<2) + (srcSize<<4)));
            break;
        default:   /* not necessary : flSize is {1,2,3} */
            assert(0);
    }

    ZSTD_memcpy(ostart + flSize, src, srcSize);
    DEBUGLOG(5, "Raw (uncompressed) literals: %u -> %u", (U32)srcSize, (U32)(srcSize + flSize));
    return srcSize + flSize;
}